

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypt.c
# Opt level: O0

void encrypt(char *__block,int __edflag)

{
  uchar *in_stack_00000140;
  uchar *in_stack_00000148;
  uchar *in_stack_00000150;
  uchar *in_stack_00000240;
  
  gen_e(in_stack_00000240);
  syndrome(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  return;
}

Assistant:

void encrypt(unsigned char *s, const unsigned char *pk, unsigned char *e)
{
	gen_e(e);

#ifdef KAT
  {
    int k;
    printf("encrypt e: positions");
    for (k = 0;k < SYS_N;++k)
      if (e[k/8] & (1 << (k&7)))
        printf(" %d",k);
    printf("\n");
  }
#endif

	syndrome(s, pk, e);
}